

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O3

optional<bidfx_public_api::price::pixie::SubscriptionSync> * __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync
          (optional<bidfx_public_api::price::pixie::SubscriptionSync> *__return_storage_ptr__,
          SubjectSetRegister *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  long lVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int edition;
  Subject *that;
  pointer this_00;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  subject_set;
  unique_lock<std::mutex> lck;
  SubscriptionSync result;
  undefined1 local_c5;
  int local_c4;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_c0;
  unique_lock<std::mutex> local_a8;
  undefined1 local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90 [3];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  local_78;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_48;
  
  local_a8._M_owns = false;
  local_a8._M_device = &this->mutex_;
  std::unique_lock<std::mutex>::lock(&local_a8);
  local_a8._M_owns = true;
  if (this->modified_ == false) {
    (__return_storage_ptr__->
    super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>)._M_payload
    .super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>.
    super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>._M_engaged =
         false;
    goto LAB_001ab4bb;
  }
  this->modified_ = false;
  CurrentSubjectSetSorted(&local_c0,this);
  if ((this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    edition = 0;
  }
  else {
    lVar3 = std::_Rb_tree_decrement
                      (&(this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header._M_header);
    edition = *(int *)(lVar3 + 0x20);
  }
  p_Var5 = (this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 == (_Base_ptr)0x0) {
LAB_001ab413:
    local_c4 = edition + 1;
    local_98 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<bidfx_public_api::price::pixie::EditionData,std::allocator<bidfx_public_api::price::pixie::EditionData>,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>&>
              (local_90,(EditionData **)local_98,
               (allocator<bidfx_public_api::price::pixie::EditionData> *)&local_c5,&local_c0);
    std::
    map<int,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>>>>
    ::insert_or_assign<std::shared_ptr<bidfx_public_api::price::pixie::EditionData>>
              ((map<int,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<bidfx_public_api::price::pixie::EditionData>>>>
                *)&this->subject_set_cache_,&local_c4,
               (shared_ptr<bidfx_public_api::price::pixie::EditionData> *)local_98);
    if (local_90[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90[0]._M_pi);
    }
    CreateSubscriptionSync((SubscriptionSync *)local_98,this,local_c4,&local_c0);
    CleanUnsubscribeState(this);
    SubscriptionSync::SubscriptionSync
              ((SubscriptionSync *)__return_storage_ptr__,(SubscriptionSync *)local_98);
    (__return_storage_ptr__->
    super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>)._M_payload
    .super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>.
    super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>._M_engaged = true
    ;
  }
  else {
    p_Var1 = &(this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      if (edition <= (int)p_Var5[1]._M_color) {
        p_Var4 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < edition];
    } while (p_Var5 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var4 == p_Var1) || (edition < (int)p_Var4[1]._M_color)) ||
       (that = *(Subject **)p_Var4[1]._M_parent,
       this_00 = local_c0.
                 super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (long)local_c0.
             super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_c0.
             super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
             ._M_impl.super__Vector_impl_data._M_start !=
       (long)(p_Var4[1]._M_parent)->_M_parent - (long)that)) goto LAB_001ab413;
    for (; this_00 !=
           local_c0.
           super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
           ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      bVar2 = price::subject::Subject::operator==(this_00,that);
      if (!bVar2) goto LAB_001ab413;
      that = that + 1;
    }
    CreateSubscriptionSync((SubscriptionSync *)local_98,this,edition,&local_c0);
    bVar2 = SubscriptionSync::HasControls((SubscriptionSync *)local_98);
    if (bVar2) {
      SubscriptionSync::SetChangedEdition((SubscriptionSync *)local_98,false);
      SubscriptionSync::SubscriptionSync
                ((SubscriptionSync *)__return_storage_ptr__,(SubscriptionSync *)local_98);
    }
    (__return_storage_ptr__->
    super__Optional_base<bidfx_public_api::price::pixie::SubscriptionSync,_false,_false>)._M_payload
    .super__Optional_payload<bidfx_public_api::price::pixie::SubscriptionSync,_true,_false,_false>.
    super__Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>._M_engaged =
         bVar2;
  }
  local_98 = (undefined1  [8])&PTR_Encode_001e6a48;
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_48);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  ::~_Rb_tree(&local_78);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_c0);
LAB_001ab4bb:
  std::unique_lock<std::mutex>::~unique_lock(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::optional<SubscriptionSync> SubjectSetRegister::NextSubscriptionSync()
{
    std::unique_lock<std::mutex> lck(mutex_);
    if (!modified_) { return {}; }
    modified_ = false;

    std::vector<Subject> subject_set = CurrentSubjectSetSorted();
    int edition = subject_set_cache_.empty() ? 0 : subject_set_cache_.rbegin()->first;
    auto edition_data = subject_set_cache_.find(edition);

    if (edition_data != subject_set_cache_.end() && subject_set == edition_data->second->GetSubjects())
    {
        SubscriptionSync subscription_sync = CreateSubscriptionSync(edition, subject_set);
        if (!subscription_sync.HasControls())
        {
            return {};
        }
        subscription_sync.SetChangedEdition(false);
        return std::move(subscription_sync);
    }

    subject_set_cache_.insert_or_assign(++edition, std::make_shared<EditionData>(subject_set));
    SubscriptionSync result = CreateSubscriptionSync(edition, subject_set);
    CleanUnsubscribeState();
    return std::move(result);
}